

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall
PString::SetDefaultValue
          (PString *this,void *base,uint offset,
          TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
          *special)

{
  uint uVar1;
  pair<const_PType_*,_unsigned_int> *ppVar2;
  
  *(undefined8 *)((long)base + (ulong)offset) = 0x8a502c;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if (special !=
      (TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *)0x0
     ) {
    TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>::Grow
              (special,1);
    ppVar2 = special->Array;
    uVar1 = special->Count;
    ppVar2[uVar1].first = (PType *)this;
    ppVar2[uVar1].second = offset;
    special->Count = special->Count + 1;
  }
  return;
}

Assistant:

void PString::SetDefaultValue(void *base, unsigned offset, TArray<FTypeAndOffset> *special) const
{
	new((BYTE *)base + offset) FString;
	if (special != NULL)
	{
		special->Push(std::make_pair(this, offset));
	}
}